

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_clib___index(lua_State *L)

{
  CTState *cts_00;
  uint sid_00;
  int iVar1;
  TValue *pTVar2;
  CType *ct;
  void *sp;
  CTypeID sid;
  CType *s;
  GCcdata *cd;
  CTState *cts;
  TValue *tv;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_90;
  CType *ct_1;
  
  pTVar2 = ffi_clib_index(L);
  if ((int)(pTVar2->field_4).it >> 0xf == -0xb) {
    cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
    cts_00->L = L;
    if (cts_00->tab[*(ushort *)((pTVar2->u64 & 0x7fffffffffff) + 10)].info >> 0x1c == 0xc) {
      sid_00 = cts_00->tab[*(ushort *)((pTVar2->u64 & 0x7fffffffffff) + 10)].info & 0xffff;
      for (local_90 = cts_00->tab + sid_00; local_90->info >> 0x1c == 8;
          local_90 = cts_00->tab + (local_90->info & 0xffff)) {
      }
      iVar1 = lj_cconv_tv_ct(cts_00,local_90,sid_00,L->top + -1,
                             *(uint8_t **)((pTVar2->u64 & 0x7fffffffffff) + 0x10));
      if (iVar1 == 0) {
        return 1;
      }
      if (*(ulong *)((L->glref).ptr64 + 0x10) < *(ulong *)((L->glref).ptr64 + 0x18)) {
        return 1;
      }
      lj_gc_step(L);
      return 1;
    }
  }
  L->top[-1] = *pTVar2;
  return 1;
}

Assistant:

LJLIB_CF(ffi_clib___index)	LJLIB_REC(clib_index 1)
{
  TValue *tv = ffi_clib_index(L);
  if (tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *s = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(s->info)) {
      CTypeID sid = ctype_cid(s->info);
      void *sp = *(void **)cdataptr(cd);
      CType *ct = ctype_raw(cts, sid);
      if (lj_cconv_tv_ct(cts, ct, sid, L->top-1, sp))
	lj_gc_check(L);
      return 1;
    }
  }
  copyTV(L, L->top-1, tv);
  return 1;
}